

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hugeint.hpp
# Opt level: O2

hugeint_t duckdb::Hugeint::Convert<long>(long value)

{
  bool bVar1;
  OutOfRangeException *this;
  hugeint_t result;
  
  bVar1 = TryConvert<long>(value,&result);
  if (bVar1) {
    return result;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  OutOfRangeException::OutOfRangeException(this,(double)value,INT64,INT128);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static hugeint_t Convert(T value) {
		hugeint_t result;
		if (!TryConvert(value, result)) { // LCOV_EXCL_START
			throw OutOfRangeException(double(value), GetTypeId<T>(), GetTypeId<hugeint_t>());
		} // LCOV_EXCL_STOP
		return result;
	}